

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O3

void __thiscall
duckdb::CatalogSet::Scan(CatalogSet *this,function<void_(duckdb::CatalogEntry_&)> *callback)

{
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> _Var1;
  int iVar2;
  reference<CatalogEntry> entry;
  CatalogEntry *pCVar3;
  _Base_ptr p_Var4;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->catalog_lock);
  if (iVar2 != 0) {
    ::std::__throw_system_error(iVar2);
  }
  p_Var4 = (this->map).entries._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var4 == &(this->map).entries._M_t._M_impl.super__Rb_tree_header) {
      pthread_mutex_unlock((pthread_mutex_t *)&this->catalog_lock);
      return;
    }
    pCVar3 = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::
             operator*((unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>
                        *)(p_Var4 + 2));
    _Var1._M_head_impl =
         (pCVar3->child).
         super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t.
         super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
         super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl;
    while ((_Var1._M_head_impl != (CatalogEntry *)0x0 &&
           (0x400000000000005f < (pCVar3->timestamp).super___atomic_base<unsigned_long>._M_i))) {
      pCVar3 = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::
               operator*(&pCVar3->child);
      _Var1._M_head_impl =
           (pCVar3->child).
           super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t.
           super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>
           .super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl;
    }
    if (pCVar3->deleted == false) {
      if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) {
        ::std::__throw_bad_function_call();
      }
      (*callback->_M_invoker)((_Any_data *)callback,pCVar3);
    }
    p_Var4 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4);
  } while( true );
}

Assistant:

void CatalogSet::Scan(const std::function<void(CatalogEntry &)> &callback) {
	// lock the catalog set
	lock_guard<mutex> lock(catalog_lock);
	for (auto &kv : map.Entries()) {
		auto &entry = *kv.second;
		auto &commited_entry = GetCommittedEntry(entry);
		if (!commited_entry.deleted) {
			callback(commited_entry);
		}
	}
}